

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void init::AddLoggingArgs(ArgsManager *argsman)

{
  Logger *pLVar1;
  char **in_RCX;
  Level level;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  OptionsCategory local_b8;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"-debuglogfile=<file>",(allocator<char> *)&local_90);
  tinyformat::format<char_const*>
            (&local_50,
             (tinyformat *)
             "Specify location of debug log file (default: %s). Relative paths will be prefixed by a net-specific datadir location. Pass -nodebuglogfile to disable writing the log to a file."
             ,(char *)&DEFAULT_DEBUGLOGFILE,in_RCX);
  local_70._M_dataplus._M_p._0_4_ = 0;
  ArgsManager::AddArg(argsman,&local_30,&local_50,1,(OptionsCategory *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"-debug=<category>",(allocator<char> *)&local_b8);
  pLVar1 = LogInstance();
  BCLog::Logger::LogCategoriesString_abi_cxx11_(&local_90,pLVar1);
  std::operator+(&local_70,
                 "Output debug and trace logging (default: -nodebug, supplying <category> is optional). If <category> is not supplied or if <category> is 1 or \"all\", output all debug logging. If <category> is 0 or \"none\", any other categories are ignored. Other valid values for <category> are: "
                 ,&local_90);
  std::operator+(&local_50,&local_70,
                 ". This option can be specified multiple times to output multiple categories.");
  local_b0._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_30,&local_50,1,(OptionsCategory *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"-debugexclude=<category>",(allocator<char> *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "Exclude debug and trace logging for a category. Can be used in conjunction with -debug=1 to output debug and trace logging for all categories except the specified category. This option can be specified multiple times to exclude multiple categories. This takes priority over \"-debug\""
             ,(allocator<char> *)&local_b0);
  local_70._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_30,&local_50,1,(OptionsCategory *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"-logips",(allocator<char> *)&local_90);
  tinyformat::format<bool>
            (&local_50,"Include IP addresses in debug output (default: %u)",(bool *)&DEFAULT_LOGIPS)
  ;
  local_70._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_30,&local_50,1,(OptionsCategory *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"-loglevel=<level>|<category>:<level>",&local_b1);
  pLVar1 = LogInstance();
  BCLog::Logger::LogLevelsString_abi_cxx11_(&local_70,pLVar1);
  LogInstance();
  BCLog::Logger::LogLevelToStr_abi_cxx11_(&local_90,(Logger *)&DAT_00000001,level);
  pLVar1 = LogInstance();
  BCLog::Logger::LogCategoriesString_abi_cxx11_(&local_b0,pLVar1);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (&local_50,
             (tinyformat *)
             "Set the global or per-category severity level for logging categories enabled with the -debug configuration option or the logging RPC. Possible values are %s (default=%s). The following levels are always logged: error, warning, info. If <category>:<level> is supplied, the setting will override the global one and may be specified multiple times to set multiple category-specific levels. <category> can be: %s."
             ,(char *)&local_70,&local_90,&local_b0,in_R9);
  local_b8 = DEBUG_TEST;
  ArgsManager::AddArg(argsman,&local_30,&local_50,0x160,&local_b8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"-logtimestamps",(allocator<char> *)&local_90);
  tinyformat::format<bool>
            (&local_50,"Prepend debug output with timestamp (default: %u)",
             (bool *)&DEFAULT_LOGTIMESTAMPS);
  local_70._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_30,&local_50,1,(OptionsCategory *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"-logthreadnames",(allocator<char> *)&local_90);
  tinyformat::format<bool>
            (&local_50,"Prepend debug output with name of the originating thread (default: %u)",
             (bool *)&DEFAULT_LOGTHREADNAMES);
  local_70._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_30,&local_50,1,(OptionsCategory *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"-logsourcelocations",(allocator<char> *)&local_90);
  tinyformat::format<bool>
            (&local_50,
             "Prepend debug output with name of the originating source location (source file, line number and function name) (default: %u)"
             ,(bool *)&DEFAULT_LOGSOURCELOCATIONS);
  local_70._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_30,&local_50,1,(OptionsCategory *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"-logtimemicros",(allocator<char> *)&local_90);
  tinyformat::format<bool>
            (&local_50,"Add microsecond precision to debug timestamps (default: %u)",
             (bool *)&DEFAULT_LOGTIMEMICROS);
  local_70._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_30,&local_50,0x101,(OptionsCategory *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"-loglevelalways",(allocator<char> *)&local_90);
  tinyformat::format<bool>
            (&local_50,"Always prepend a category and level (default: %u)",
             (bool *)&DEFAULT_LOGLEVELALWAYS);
  local_70._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_30,&local_50,1,(OptionsCategory *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"-printtoconsole",(allocator<char> *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "Send trace/debug info to console (default: 1 when no -daemon. To disable logging to file, set -nodebuglogfile)"
             ,(allocator<char> *)&local_b0);
  local_70._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_30,&local_50,1,(OptionsCategory *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"-shrinkdebugfile",(allocator<char> *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "Shrink debug.log file on client startup (default: 1 when no -debug)",
             (allocator<char> *)&local_b0);
  local_70._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_30,&local_50,1,(OptionsCategory *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddLoggingArgs(ArgsManager& argsman)
{
    argsman.AddArg("-debuglogfile=<file>", strprintf("Specify location of debug log file (default: %s). Relative paths will be prefixed by a net-specific datadir location. Pass -nodebuglogfile to disable writing the log to a file.", DEFAULT_DEBUGLOGFILE), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-debug=<category>", "Output debug and trace logging (default: -nodebug, supplying <category> is optional). "
        "If <category> is not supplied or if <category> is 1 or \"all\", output all debug logging. If <category> is 0 or \"none\", any other categories are ignored. Other valid values for <category> are: " + LogInstance().LogCategoriesString() + ". This option can be specified multiple times to output multiple categories.",
        ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-debugexclude=<category>", "Exclude debug and trace logging for a category. Can be used in conjunction with -debug=1 to output debug and trace logging for all categories except the specified category. This option can be specified multiple times to exclude multiple categories. This takes priority over \"-debug\"", ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-logips", strprintf("Include IP addresses in debug output (default: %u)", DEFAULT_LOGIPS), ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-loglevel=<level>|<category>:<level>", strprintf("Set the global or per-category severity level for logging categories enabled with the -debug configuration option or the logging RPC. Possible values are %s (default=%s). The following levels are always logged: error, warning, info. If <category>:<level> is supplied, the setting will override the global one and may be specified multiple times to set multiple category-specific levels. <category> can be: %s.", LogInstance().LogLevelsString(), LogInstance().LogLevelToStr(BCLog::DEFAULT_LOG_LEVEL), LogInstance().LogCategoriesString()), ArgsManager::DISALLOW_NEGATION | ArgsManager::DISALLOW_ELISION | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-logtimestamps", strprintf("Prepend debug output with timestamp (default: %u)", DEFAULT_LOGTIMESTAMPS), ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-logthreadnames", strprintf("Prepend debug output with name of the originating thread (default: %u)", DEFAULT_LOGTHREADNAMES), ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-logsourcelocations", strprintf("Prepend debug output with name of the originating source location (source file, line number and function name) (default: %u)", DEFAULT_LOGSOURCELOCATIONS), ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-logtimemicros", strprintf("Add microsecond precision to debug timestamps (default: %u)", DEFAULT_LOGTIMEMICROS), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-loglevelalways", strprintf("Always prepend a category and level (default: %u)", DEFAULT_LOGLEVELALWAYS), ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-printtoconsole", "Send trace/debug info to console (default: 1 when no -daemon. To disable logging to file, set -nodebuglogfile)", ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-shrinkdebugfile", "Shrink debug.log file on client startup (default: 1 when no -debug)", ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
}